

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor_tmpl_impl.hpp
# Opt level: O3

void __thiscall
hiberlite::AVisitor<hiberlite::KillChildren>::startWalk<A>
          (AVisitor<hiberlite::KillChildren> *this,A *obj,bean_key *key)

{
  int *piVar1;
  shared_cnt_obj_pair<hiberlite::autoclosed_con> *psVar2;
  KillChildren *this_00;
  _Elt_pointer plVar3;
  shared_cnt_obj_pair<hiberlite::autoclosed_con> *psVar4;
  string ClassName;
  undefined1 *local_e8;
  long local_e0;
  undefined1 local_d8 [16];
  undefined1 *local_c8;
  long local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [32];
  _Elt_pointer local_88;
  _Map_pointer ppSStack_80;
  Scope local_78;
  
  (this->rootKey).id = key->id;
  psVar4 = (key->con).res;
  psVar2 = (this->rootKey).con.res;
  if (psVar4 != psVar2) {
    if (psVar2 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      piVar1 = &psVar2->refCount;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*psVar2->_vptr_shared_cnt_obj_pair[1])();
        psVar4 = (key->con).res;
      }
    }
    (this->rootKey).con.res = psVar4;
    if (psVar4 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      psVar4->refCount = psVar4->refCount + 1;
    }
  }
  local_78._table.field_2._M_allocated_capacity = 0;
  local_78._table.field_2._8_8_ = (_Map_pointer)0x0;
  local_78._table._M_dataplus._M_p = (pointer)0x0;
  local_78._table._M_string_length = 0;
  local_88 = (_Elt_pointer)0x0;
  ppSStack_80 = (_Map_pointer)0x0;
  local_a8._16_8_ = (_Elt_pointer)0x0;
  local_a8._24_8_ = (_Elt_pointer)0x0;
  local_a8._0_8_ = (_Map_pointer)0x0;
  local_a8._8_8_ = 0;
  std::_Deque_base<hiberlite::Scope,_std::allocator<hiberlite::Scope>_>::_M_initialize_map
            ((_Deque_base<hiberlite::Scope,_std::allocator<hiberlite::Scope>_> *)local_a8,0);
  std::deque<hiberlite::Scope,_std::allocator<hiberlite::Scope>_>::_M_move_assign1
            (&(this->stack).c,
             (_Deque_base<hiberlite::Scope,_std::allocator<hiberlite::Scope>_> *)local_a8);
  std::deque<hiberlite::Scope,_std::allocator<hiberlite::Scope>_>::~deque
            ((deque<hiberlite::Scope,_std::allocator<hiberlite::Scope>_> *)local_a8);
  Database::getClassName<A>();
  local_c8 = local_b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,local_78._prefix._M_string_length,
             (undefined1 *)
             (local_78._prefix._M_string_length + local_78._prefix.field_2._M_allocated_capacity));
  local_e8 = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
  local_a8._0_8_ = local_a8 + 0x10;
  std::__cxx11::string::_M_construct<char*>((string *)local_a8,local_c8,local_c8 + local_c0);
  local_88 = &local_78;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_e8,local_e8 + local_e0);
  local_78._table.field_2._M_allocated_capacity =
       local_78._table.field_2._M_allocated_capacity & 0xffffffff00000000;
  std::__cxx11::string::operator=((string *)&this->scope,(string *)local_a8);
  std::__cxx11::string::operator=((string *)&(this->scope)._prefix,(string *)&local_88);
  (this->scope).prefix_depth = local_78._table.field_2._M_allocated_capacity._0_4_;
  if (local_88 != &local_78) {
    operator_delete(local_88);
  }
  if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
    operator_delete((void *)local_a8._0_8_);
  }
  if (local_e8 != local_d8) {
    operator_delete(local_e8);
  }
  if (local_c8 != local_b8) {
    operator_delete(local_c8);
  }
  this_00 = this->actor;
  local_78._table.field_2._M_allocated_capacity = 0;
  local_78._table.field_2._8_8_ = (_Map_pointer)0x0;
  local_78._table._M_dataplus._M_p = (pointer)0x0;
  local_78._table._M_string_length = 0;
  local_88 = (_Elt_pointer)0x0;
  ppSStack_80 = (_Map_pointer)0x0;
  local_a8._16_8_ = (_Elt_pointer)0x0;
  local_a8._24_8_ = (_Elt_pointer)0x0;
  local_a8._0_8_ = (_Map_pointer)0x0;
  local_a8._8_8_ = 0;
  std::_Deque_base<long_long,_std::allocator<long_long>_>::_M_initialize_map
            ((_Deque_base<long_long,_std::allocator<long_long>_> *)local_a8,0);
  std::deque<long_long,_std::allocator<long_long>_>::_M_move_assign1
            ((deque<long_long,_std::allocator<long_long>_> *)this_00,
             (_Deque_base<long_long,_std::allocator<long_long>_> *)local_a8);
  std::_Deque_base<long_long,_std::allocator<long_long>_>::~_Deque_base
            ((_Deque_base<long_long,_std::allocator<long_long>_> *)local_a8);
  local_a8._0_8_ = (this->rootKey).id;
  plVar3 = (((_Deque_base<long_long,_std::allocator<long_long>_> *)&this_00->rowId)->_M_impl).
           super__Deque_impl_data._M_finish._M_cur;
  if (plVar3 == (((_Deque_base<long_long,_std::allocator<long_long>_> *)&this_00->rowId)->_M_impl).
                super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<long_long,_std::allocator<long_long>_>::_M_push_back_aux<long_long>
              ((deque<long_long,_std::allocator<long_long>_> *)this_00,(longlong *)local_a8);
  }
  else {
    *plVar3 = local_a8._0_8_;
    (((_Deque_base<long_long,_std::allocator<long_long>_> *)&this_00->rowId)->_M_impl).
    super__Deque_impl_data._M_finish._M_cur = plVar3 + 1;
  }
  A::hibernate<hiberlite::AVisitor<hiberlite::KillChildren>>(obj,this);
  if ((undefined1 *)local_78._prefix._M_string_length !=
      (undefined1 *)((long)&local_78._prefix.field_2 + 8)) {
    operator_delete((void *)local_78._prefix._M_string_length);
  }
  return;
}

Assistant:

void AVisitor<C>::startWalk(Y& obj, bean_key key)
{
	rootKey=key;
	stack=std::stack<Scope>();
	std::string ClassName=Database::getClassName<Y>();
	scope=Scope(ClassName,"");

	actor->notifyInitWalk(*this);
		walk(obj);
	actor->notifyDoneWalk(*this);
}